

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsTTDRawBufferAsyncModificationRegister(JsValueRef instance,byte *initialModPos)

{
  ScriptContext *scriptContext;
  bool bVar1;
  int iVar2;
  uint uVar3;
  JsErrorCode JVar4;
  JsrtContext *pJVar5;
  ArrayBuffer *trgt;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ArrayBuffer *pAVar6;
  uint32 index;
  void *unaff_retaddr;
  undefined1 auStack_b8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType local_3c;
  ScriptContext *pSStack_38;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  pJVar5 = JsrtContext::GetCurrent();
  trgt = (ArrayBuffer *)0x0;
  JVar4 = JsErrorNoCurrentContext;
  if (pJVar5 != (JsrtContext *)0x0) {
    scriptContext =
         (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    pSStack_38 = scriptContext;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (&local_3c,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
    __entryExitRecord.scriptContext = (ScriptContext *)0x0;
    __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
    __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
    auStack_b8 = (undefined1  [8])0x0;
    __entryExitRecord._0_1_ = 0;
    __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
    __entryExitRecord._2_6_ = 0;
    __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
               (ScriptEntryExitRecord *)auStack_b8,unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(scriptContext,true,true);
    Js::EnterScriptObject::VerifyEnterScript
              ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
    JVar4 = JsNoError;
    if (pSStack_38->TTDRecordModeEnabled == true) {
      bVar1 = Js::VarIs<Js::ArrayBuffer>(instance);
      if (!bVar1) {
        TTDAbort_unrecoverable_error("Not array buffer object!!!");
      }
      trgt = Js::VarTo<Js::ArrayBuffer>(instance);
      iVar2 = (*(trgt->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(trgt);
      _actionEntryPopper.m_resultPtr = (TTDVar *)anon_var_dwarf_1911bd;
      if (initialModPos < (byte *)CONCAT44(extraout_var,iVar2)) {
LAB_003882c6:
        TTDAbort_unrecoverable_error((char *)_actionEntryPopper.m_resultPtr);
      }
      iVar2 = (*(trgt->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(trgt);
      uVar3 = (*(trgt->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x71])(trgt);
      if ((byte *)(CONCAT44(extraout_var_00,iVar2) + (ulong)uVar3) <= initialModPos)
      goto LAB_003882c6;
      iVar2 = (*(trgt->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(trgt);
      if (0xfffffffe < (long)initialModPos - CONCAT44(extraout_var_01,iVar2)) {
        _actionEntryPopper.m_resultPtr = (TTDVar *)anon_var_dwarf_1911ca;
        goto LAB_003882c6;
      }
      pAVar6 = Js::VarTo<Js::ArrayBuffer>(instance);
      iVar2 = (*(pAVar6->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(pAVar6);
      index = (int)initialModPos - iVar2;
      TTD::ScriptContextTTD::AddToAsyncPendingList(pSStack_38->TTDContextInfo,trgt,index);
      if (pSStack_38->TTDShouldPerformRecordAction == true) {
        TTD::EventLog::RecordJsRTRawBufferAsyncModificationRegister
                  (pSStack_38->threadContext->TTDLog,
                   (TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,instance,index);
      }
    }
    else {
      trgt = (ArrayBuffer *)0x0;
    }
    Js::EnterScriptObject::~EnterScriptObject
              ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_3c);
  }
  if (__enterScriptObject.library != (JavascriptLibrary *)0x0) {
    if (*(int *)((long)&((__enterScriptObject.library)->super_JavascriptLibraryBase).
                        super_FinalizableObject.super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject + 4) != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    *(JsErrorCode *)
     ((long)&((__enterScriptObject.library)->super_JavascriptLibraryBase).super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4) = JVar4;
  }
  if (JVar4 == JsNoError) {
    if (trgt == (ArrayBuffer *)0x0) {
      JVar4 = JsNoError;
    }
    else {
      JVar4 = JsAddRef(trgt,(uint *)0x0);
    }
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsTTDRawBufferAsyncModificationRegister(_In_ JsValueRef instance, _In_ byte* initialModPos)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsValueRef addRefObj = nullptr;
    JsErrorCode addRefResult = ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        if (scriptContext->IsTTDRecordModeEnabled())
        {
            TTDAssert(Js::VarIs<Js::ArrayBuffer>(instance), "Not array buffer object!!!");
            Js::ArrayBuffer* dstBuff = Js::VarTo<Js::ArrayBuffer>(instance);
            addRefObj = dstBuff;

            TTDAssert(dstBuff->GetBuffer() <= initialModPos && initialModPos < dstBuff->GetBuffer() + dstBuff->GetByteLength(), "Not array buffer object!!!");
            TTDAssert(initialModPos - dstBuff->GetBuffer() < UINT32_MAX, "This is really big!!!");
            ptrdiff_t index = initialModPos - Js::VarTo<Js::ArrayBuffer>(instance)->GetBuffer();

            scriptContext->TTDContextInfo->AddToAsyncPendingList(dstBuff, (uint32)index);

            PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTRawBufferAsyncModificationRegister, instance, (uint32)index);
        }

        return JsNoError;
    });

    if(addRefResult != JsNoError)
    {
        return addRefResult;
    }

    //We need to root add ref so we can find this during replay!!!
    if(addRefObj == nullptr)
    {
        return JsNoError;
    }
    else
    {
        return JsAddRef(addRefObj, nullptr);
    }
#endif
}